

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesEncoder::TransformAttributesToPortableFormat(KdTreeAttributesEncoder *this)

{
  PointCloud *pPVar1;
  PointCloudEncoder *pPVar2;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> attribute;
  iterator __position;
  EncoderOptions *pEVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  AttributeValueIndex att_id_00;
  int iVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  AttributeTransform AVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  long lVar14;
  float range;
  vector<int,_std::allocator<int>_> act_value;
  int att_id;
  vector<float,_std::allocator<float>_> quantization_origin;
  vector<int,_std::allocator<int>_> min_value;
  string local_c8;
  int local_a8;
  int local_a4;
  string local_a0;
  _func_int **local_80;
  AttributeQuantizationTransform local_78;
  float local_48;
  ValueType local_44;
  vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
  *local_40;
  _Head_base<0UL,_draco::DataBuffer_*,_false> local_38;
  
  pPVar1 = ((this->super_AttributesEncoder).point_cloud_encoder_)->point_cloud_;
  piVar12 = (this->super_AttributesEncoder).point_attribute_ids_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->super_AttributesEncoder).point_attribute_ids_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar12) >> 2);
  if (iVar6 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar11 = 0;
    do {
      iVar7 = iVar7 + (uint)*(byte *)((long)(pPVar1->attributes_).
                                            super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [piVar12[iVar11]]._M_t.
                                            super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                            ._M_t + 0x18);
      iVar11 = iVar11 + 1;
    } while (iVar6 != iVar11);
  }
  local_44 = pPVar1->num_points_;
  this->num_components_ = iVar7;
  if (iVar6 != 0) {
    local_38._M_head_impl = (DataBuffer *)&this->attribute_quantization_transforms_;
    local_40 = (vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
                *)&this->quantized_portable_attributes_;
    uVar13 = 0;
    local_80 = (_func_int **)&PTR__AttributeQuantizationTransform_001dcaa0;
    do {
      local_a8 = piVar12[(int)uVar13];
      pPVar2 = (this->super_AttributesEncoder).point_cloud_encoder_;
      attribute._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (pPVar2->point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_a8]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      switch(*(DataType *)
              ((long)attribute._M_t.
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x1c)) {
      case DT_INT8:
      case DT_INT16:
      case DT_INT32:
        local_c8._M_dataplus._M_p._0_4_ = 0x7fffffff;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_78,
                   (ulong)*(uint8_t *)
                           ((long)attribute._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 0x18),(value_type_conflict1 *)&local_c8,
                   (allocator_type *)&local_a0);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_c8,
                   (ulong)*(uint8_t *)
                           ((long)attribute._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 0x18),(allocator_type *)&local_a0);
        uVar5 = (ulong)*(uint8_t *)
                        ((long)attribute._M_t.
                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                        0x18);
        if (*(ValueType *)
             ((long)attribute._M_t.
                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x60) != 0
           ) {
          att_id_00.value_ = 0;
          do {
            GeometryAttribute::ConvertValue<int>
                      ((GeometryAttribute *)
                       attribute._M_t.
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,att_id_00
                       ,(int8_t)uVar5,(int *)local_c8._M_dataplus._M_p);
            uVar5 = (ulong)*(uint8_t *)
                            ((long)attribute._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x18);
            if (uVar5 != 0) {
              uVar8 = 0;
              do {
                if (*(int *)(local_c8._M_dataplus._M_p + uVar8 * 4) <
                    *(int *)((long)local_78.super_AttributeTransform._vptr_AttributeTransform +
                            uVar8 * 4)) {
                  *(int *)((long)local_78.super_AttributeTransform._vptr_AttributeTransform +
                          uVar8 * 4) = *(int *)(local_c8._M_dataplus._M_p + uVar8 * 4);
                }
                uVar8 = uVar8 + 1;
              } while (uVar5 != uVar8);
            }
            att_id_00.value_ = att_id_00.value_ + 1;
          } while (att_id_00.value_ <
                   *(ValueType *)
                    ((long)attribute._M_t.
                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                    0x60));
        }
        if ((char)uVar5 != '\0') {
          lVar14 = 0;
          uVar8 = 0;
          do {
            __position._M_current =
                 (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->min_signed_values_,__position,
                         (int *)((long)local_78.super_AttributeTransform._vptr_AttributeTransform +
                                lVar14));
              uVar5 = (ulong)*(uint8_t *)
                              ((long)attribute._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x18);
            }
            else {
              *__position._M_current =
                   *(int *)((long)local_78.super_AttributeTransform._vptr_AttributeTransform +
                           lVar14);
              (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar8 = uVar8 + 1;
            lVar14 = lVar14 + 4;
          } while (uVar8 < uVar5);
        }
        if ((int *)local_c8._M_dataplus._M_p != (int *)0x0) {
          operator_delete(local_c8._M_dataplus._M_p,
                          local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
        }
        pp_Var9 = (_func_int **)
                  local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        AVar10._vptr_AttributeTransform = local_78.super_AttributeTransform._vptr_AttributeTransform
        ;
        if (local_78.super_AttributeTransform._vptr_AttributeTransform != (_func_int **)0x0) {
LAB_001679d1:
          operator_delete(AVar10._vptr_AttributeTransform,
                          (long)pp_Var9 - (long)AVar10._vptr_AttributeTransform);
        }
        break;
      case DT_FLOAT32:
        local_78.super_AttributeTransform._vptr_AttributeTransform = local_80;
        local_78.quantization_bits_ = -1;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = false;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_78.range_ = 0.0;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = '\0';
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._1_3_ = 0;
        local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = DT_INVALID;
        pEVar3 = pPVar2->options_;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"quantization_bits","");
        local_a4 = DracoOptions<int>::GetAttributeInt
                             (&pEVar3->super_DracoOptions<int>,&local_a8,&local_c8,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_a4 < 1) {
LAB_001679fd:
          local_78.super_AttributeTransform._vptr_AttributeTransform = local_80;
          if ((_func_int **)
              local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_78.min_values_.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_,
                                     local_78.min_values_.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._0_4_) -
                            (long)local_78.min_values_.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          return false;
        }
        pEVar3 = ((this->super_AttributesEncoder).point_cloud_encoder_)->options_;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"quantization_origin","");
        bVar4 = DracoOptions<int>::IsAttributeOptionSet
                          (&pEVar3->super_DracoOptions<int>,&local_a8,&local_c8);
        if (bVar4) {
          pEVar3 = ((this->super_AttributesEncoder).point_cloud_encoder_)->options_;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"quantization_range","");
          bVar4 = DracoOptions<int>::IsAttributeOptionSet
                            (&pEVar3->super_DracoOptions<int>,&local_a8,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar4 == false) {
          bVar4 = AttributeQuantizationTransform::ComputeParameters
                            (&local_78,
                             (PointAttribute *)
                             attribute._M_t.
                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                             local_a4);
          if (!bVar4) goto LAB_001679fd;
        }
        else {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_a0,
                     (ulong)*(uint8_t *)
                             ((long)attribute._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl + 0x18),(allocator_type *)&local_c8);
          pEVar3 = ((this->super_AttributesEncoder).point_cloud_encoder_)->options_;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"quantization_origin","");
          DracoOptions<int>::GetAttributeVector<float>
                    (&pEVar3->super_DracoOptions<int>,&local_a8,&local_c8,
                     (uint)*(uint8_t *)
                            ((long)attribute._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x18),(float *)local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          pEVar3 = ((this->super_AttributesEncoder).point_cloud_encoder_)->options_;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"quantization_range","");
          range = DracoOptions<int>::GetAttributeFloat
                            (&pEVar3->super_DracoOptions<int>,&local_a8,&local_c8,1.0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            local_48 = range;
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            range = local_48;
          }
          AttributeQuantizationTransform::SetParameters
                    (&local_78,local_a4,(float *)local_a0._M_dataplus._M_p,
                     (uint)*(uint8_t *)
                            ((long)attribute._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x18),range);
          if ((PointAttribute *)local_a0._M_dataplus._M_p != (PointAttribute *)0x0) {
            operator_delete(local_a0._M_dataplus._M_p,
                            local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p
                           );
          }
        }
        std::
        vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
        ::push_back((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                     *)local_38._M_head_impl,(value_type *)&local_78);
        AttributeTransform::InitTransformedAttribute
                  ((AttributeTransform *)&local_a0,(PointAttribute *)&local_78,
                   (int)attribute._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
        local_c8._M_dataplus._M_p = (pointer)0x0;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_allocated_capacity = 0;
        AttributeQuantizationTransform::TransformAttribute
                  (&local_78,
                   (PointAttribute *)
                   attribute._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                    *)&local_c8,(PointAttribute *)local_a0._M_dataplus._M_p);
        if ((int *)local_c8._M_dataplus._M_p != (int *)0x0) {
          operator_delete(local_c8._M_dataplus._M_p,
                          local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
        }
        std::
        vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
        ::
        emplace_back<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>
                  (local_40,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             *)&local_a0);
        if ((PointAttribute *)local_a0._M_dataplus._M_p != (PointAttribute *)0x0) {
          std::default_delete<draco::PointAttribute>::operator()
                    ((default_delete<draco::PointAttribute> *)&local_a0,
                     (PointAttribute *)local_a0._M_dataplus._M_p);
        }
        local_78.super_AttributeTransform._vptr_AttributeTransform = local_80;
        if ((_func_int **)
            local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (_func_int **)0x0) {
          pp_Var9 = (_func_int **)
                    CONCAT44(local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          AVar10._vptr_AttributeTransform =
               (_func_int **)
               local_78.min_values_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          goto LAB_001679d1;
        }
      }
      uVar13 = uVar13 + 1;
      piVar12 = (this->super_AttributesEncoder).point_attribute_ids_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar13 < (uint)((ulong)((long)(this->super_AttributesEncoder).point_attribute_ids_.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)piVar12) >> 2))
    ;
  }
  return true;
}

Assistant:

bool KdTreeAttributesEncoder::TransformAttributesToPortableFormat() {
  // Convert any of the input attributes into a format that can be processed by
  // the kd tree encoder (quantization of floating attributes for now).
  const size_t num_points = encoder()->point_cloud()->num_points();
  int num_components = 0;
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    num_components += att->num_components();
  }
  num_components_ = num_components;

  // Go over all attributes and quantize them if needed.
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_FLOAT32) {
      // Quantization path.
      AttributeQuantizationTransform attribute_quantization_transform;
      const int quantization_bits = encoder()->options()->GetAttributeInt(
          att_id, "quantization_bits", -1);
      if (quantization_bits < 1) {
        return false;
      }
      if (encoder()->options()->IsAttributeOptionSet(att_id,
                                                     "quantization_origin") &&
          encoder()->options()->IsAttributeOptionSet(att_id,
                                                     "quantization_range")) {
        // Quantization settings are explicitly specified in the provided
        // options.
        std::vector<float> quantization_origin(att->num_components());
        encoder()->options()->GetAttributeVector(att_id, "quantization_origin",
                                                 att->num_components(),
                                                 &quantization_origin[0]);
        const float range = encoder()->options()->GetAttributeFloat(
            att_id, "quantization_range", 1.f);
        attribute_quantization_transform.SetParameters(
            quantization_bits, quantization_origin.data(),
            att->num_components(), range);
      } else {
        // Compute quantization settings from the attribute values.
        if (!attribute_quantization_transform.ComputeParameters(
                *att, quantization_bits)) {
          return false;
        }
      }
      attribute_quantization_transforms_.push_back(
          attribute_quantization_transform);
      // Store the quantized attribute in an array that will be used when we do
      // the actual encoding of the data.
      auto portable_att =
          attribute_quantization_transform.InitTransformedAttribute(*att,
                                                                    num_points);
      attribute_quantization_transform.TransformAttribute(*att, {},
                                                          portable_att.get());
      quantized_portable_attributes_.push_back(std::move(portable_att));
    } else if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
               att->data_type() == DT_INT8) {
      // For signed types, find the minimum value for each component. These
      // values are going to be used to transform the attribute values to
      // unsigned integers that can be processed by the core kd tree algorithm.
      std::vector<int32_t> min_value(att->num_components(),
                                     std::numeric_limits<int32_t>::max());
      std::vector<int32_t> act_value(att->num_components());
      for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
           ++avi) {
        att->ConvertValue<int32_t>(avi, &act_value[0]);
        for (int c = 0; c < att->num_components(); ++c) {
          if (min_value[c] > act_value[c]) {
            min_value[c] = act_value[c];
          }
        }
      }
      for (int c = 0; c < att->num_components(); ++c) {
        min_signed_values_.push_back(min_value[c]);
      }
    }
  }
  return true;
}